

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void in1_r2_sr32(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  int iVar1;
  TCGv_i64 pTVar2;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  pTVar2 = tcg_temp_new_i64(tcg_ctx_00);
  o->in1 = pTVar2;
  pTVar2 = o->in1;
  iVar1 = get_field1(s,FLD_O_r2,FLD_C_b2);
  tcg_gen_shri_i64_s390x(tcg_ctx_00,pTVar2,tcg_ctx_00->regs[iVar1],0x20);
  return;
}

Assistant:

static void in1_r2_sr32(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    o->in1 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_shri_i64(tcg_ctx, o->in1, tcg_ctx->regs[get_field(s, r2)], 32);
}